

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamMultiReaderPrivate::LocateIndexes
          (BamMultiReaderPrivate *this,IndexType *preferredType)

{
  bool bVar1;
  long in_RDI;
  string message;
  string currentError;
  BamReader *reader;
  MergeItem *item;
  iterator readerEnd;
  iterator readerIter;
  bool errorsEncountered;
  vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
  *in_stack_fffffffffffffed8;
  allocator *paVar2;
  __normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
  *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  RuleToken *in_stack_fffffffffffffee8;
  allocator local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [16];
  undefined8 in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  BamMultiReaderPrivate *in_stack_ffffffffffffff50;
  string local_90 [48];
  string local_60 [32];
  BamReader *local_40;
  reference local_38;
  MergeItem *local_30;
  __normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
  local_28;
  byte local_19;
  byte local_1;
  
  local_19 = 0;
  std::__cxx11::string::clear();
  local_28._M_current =
       (MergeItem *)
       std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>::
       begin(in_stack_fffffffffffffed8);
  local_30 = (MergeItem *)
             std::
             vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>::
             end(in_stack_fffffffffffffed8);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_fffffffffffffee0,
                            (__normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
                             *)in_stack_fffffffffffffed8), bVar1) {
    local_38 = __gnu_cxx::
               __normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
               ::operator*(&local_28);
    local_40 = local_38->Reader;
    if (((local_40 != (BamReader *)0x0) &&
        (bVar1 = BamReader::HasIndex((BamReader *)0x19836c), !bVar1)) &&
       (bVar1 = BamReader::LocateIndex
                          ((BamReader *)in_stack_fffffffffffffee0,
                           (IndexType *)in_stack_fffffffffffffed8), !bVar1)) {
      in_stack_fffffffffffffee8 = (RuleToken *)(in_RDI + 0x28);
      std::__cxx11::string::append((ulong)in_stack_fffffffffffffee8,'\x01');
      BamReader::GetErrorString_abi_cxx11_((BamReader *)in_stack_fffffffffffffed8);
      std::__cxx11::string::append((string *)in_stack_fffffffffffffee8);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::append(in_RDI + 0x28,'\x01');
      local_19 = 1;
    }
    __gnu_cxx::
    __normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
    ::operator++(&local_28);
  }
  if ((local_19 & 1) == 0) {
    local_1 = 1;
  }
  else {
    std::__cxx11::string::string(local_90,(string *)(in_RDI + 0x28));
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"error while locating index files: \n",(allocator *)__rhs)
    ;
    std::operator+(in_stack_fffffffffffffee8,__rhs);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
    paVar2 = &local_f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"BamMultiReader::LocatingIndexes",paVar2);
    SetErrorString(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   (string *)in_stack_ffffffffffffff40);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    local_1 = 0;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    std::__cxx11::string::~string(local_90);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool BamMultiReaderPrivate::LocateIndexes(const BamIndex::IndexType& preferredType)
{

    bool errorsEncountered = false;
    m_errorString.clear();

    // iterate over readers
    std::vector<MergeItem>::iterator readerIter = m_readers.begin();
    std::vector<MergeItem>::iterator readerEnd = m_readers.end();
    for (; readerIter != readerEnd; ++readerIter) {
        MergeItem& item = (*readerIter);
        BamReader* reader = item.Reader;
        if (reader == 0) {
            continue;
        }

        // if reader has no index, try to locate one
        if (!reader->HasIndex()) {
            if (!reader->LocateIndex(preferredType)) {
                m_errorString.append(1, '\t');
                m_errorString.append(reader->GetErrorString());
                m_errorString.append(1, '\n');
                errorsEncountered = true;
            }
        }
    }

    // check for errors encountered before returning success/fail
    if (errorsEncountered) {
        const std::string currentError = m_errorString;
        const std::string message =
            std::string("error while locating index files: \n") + currentError;
        SetErrorString("BamMultiReader::LocatingIndexes", message);
        return false;
    } else {
        return true;
    }
}